

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

int fits_hdecompress64(uchar *input,int smooth,LONGLONG *a,int *ny,int *nx,int *scale,int *status)

{
  long lVar1;
  long lVar2;
  sbyte sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  long *plVar11;
  uint uVar12;
  LONGLONG *a_00;
  LONGLONG *pLVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  LONGLONG LVar21;
  long lVar22;
  int iVar23;
  int *piVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  uint n;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  double dVar40;
  uchar b [4];
  ulong local_168;
  undefined8 local_140;
  int *local_138;
  ulong local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  ulong local_f0;
  undefined8 local_e8;
  ulong local_e0;
  LONGLONG *local_d8;
  LONGLONG *local_d0;
  ulong local_c8;
  ulong local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  uint local_98;
  int local_94;
  int local_90;
  char local_8a [2];
  long local_88;
  LONGLONG *local_80;
  uint *local_78;
  uint *local_70;
  LONGLONG *local_68;
  long local_60;
  LONGLONG *local_58;
  LONGLONG *local_50;
  LONGLONG *local_48;
  LONGLONG *local_40;
  long local_38;
  
  iVar6 = *status;
  if (iVar6 < 1) {
    local_8a = *(char (*) [2])input;
    nextchar = 2;
    if (local_8a == code_magic) {
      local_118 = CONCAT44(local_118._4_4_,smooth);
      uVar4 = *(uint *)(input + 2) & 0xff;
      lVar19 = 1;
      do {
        uVar4 = (uint)*(byte *)((long)&local_140 + lVar19) | uVar4 << 8;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      *nx = uVar4;
      uVar4 = *(uint *)(input + 6) & 0xff;
      lVar19 = 1;
      do {
        uVar4 = (uint)*(byte *)((long)&local_140 + lVar19) | uVar4 << 8;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      *ny = uVar4;
      uVar4 = *(uint *)(input + 10) & 0xff;
      lVar19 = 1;
      do {
        uVar4 = (uint)*(byte *)((long)&local_140 + lVar19) | uVar4 << 8;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      *scale = uVar4;
      local_140 = *(ulong *)(input + 0xe);
      uVar29 = local_140 & 0xff;
      lVar19 = 1;
      do {
        uVar29 = (ulong)*(byte *)((long)&local_140 + lVar19) | uVar29 << 8;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      bVar9 = input[0x16];
      local_108 = CONCAT44(local_108._4_4_,(uint)input[0x17]);
      local_110 = CONCAT44(local_110._4_4_,(uint)input[0x18]);
      nextchar = 0x19;
      iVar7 = *nx;
      iVar10 = *ny;
      uVar4 = iVar10 * iVar7;
      iVar5 = (iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1;
      iVar34 = (iVar10 - (iVar10 + 1 >> 0x1f)) + 1 >> 1;
      local_138 = scale;
      local_78 = (uint *)ny;
      local_70 = (uint *)nx;
      if (0 < (int)uVar4) {
        memset(a,0,(ulong)uVar4 << 3);
      }
      bits_to_go = 0;
      iVar6 = qtree_decode64(input,a,iVar10,iVar5,iVar34,(uint)bVar9);
      if (iVar6 == 0) {
        iVar23 = (int)local_108;
        iVar6 = qtree_decode64(input,a + iVar34,iVar10,iVar5,iVar10 / 2,(int)local_108);
        if (iVar6 == 0) {
          local_120 = CONCAT44(local_120._4_4_,iVar10 / 2);
          iVar6 = qtree_decode64(input,a + iVar5 * iVar10,iVar10,iVar7 / 2,iVar34,iVar23);
          if (iVar6 == 0) {
            iVar6 = qtree_decode64(input,a + (iVar5 * iVar10 + iVar34),iVar10,iVar7 / 2,
                                   (int)local_120,(int)local_110);
            if (iVar6 == 0) {
              iVar6 = input_nybble(input);
              if (iVar6 == 0) {
                bits_to_go = 0;
                if (0 < (int)uVar4) {
                  uVar15 = 0;
                  uVar18 = 0;
                  lVar19 = nextchar;
                  uVar12 = buffer2;
                  do {
                    if (a[uVar15] != 0) {
                      if (uVar18 == 0) {
                        uVar12 = (uint)input[lVar19];
                        lVar19 = lVar19 + 1;
                        uVar18 = 7;
                        nextchar = lVar19;
                        buffer2 = uVar12;
                      }
                      else {
                        uVar18 = uVar18 - 1;
                      }
                      bits_to_go = uVar18;
                      if ((uVar12 >> (uVar18 & 0x1f) & 1) != 0) {
                        a[uVar15] = -a[uVar15];
                      }
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar4 != uVar15);
                }
                *a = uVar29;
                *status = 0;
                uVar4 = *local_70;
                uVar12 = *local_78;
                iVar6 = *local_138;
                if ((1 < (long)iVar6) && (plVar11 = a, a <= a + (long)(int)(uVar12 * uVar4) + -1)) {
                  do {
                    *plVar11 = *plVar11 * (long)iVar6;
                    plVar11 = plVar11 + 1;
                  } while (plVar11 <= a + (long)(int)(uVar12 * uVar4) + -1);
                }
                uVar18 = uVar12;
                if ((int)uVar12 < (int)uVar4) {
                  uVar18 = uVar4;
                }
                dVar40 = log((double)(int)uVar18);
                local_d0 = (LONGLONG *)
                           malloc((long)((int)((uVar18 - ((int)(uVar18 + 1) >> 0x1f)) + 1) >> 1) <<
                                  3);
                if (local_d0 == (LONGLONG *)0x0) {
                  ffpmsg("hinv64: insufficient memory");
                  iVar6 = 0x19e;
                }
                else {
                  iVar10 = (int)(dVar40 / 0.6931471805599453 + 0.5);
                  sVar3 = 1;
                  bVar39 = 1 << ((byte)iVar10 & 0x1f) < (int)uVar18;
                  iVar7 = (uint)bVar39 + iVar10;
                  uVar18 = (iVar10 + (uint)bVar39) - 1;
                  local_e0 = (ulong)uVar18;
                  bVar9 = (byte)uVar18;
                  uVar29 = 1L << (bVar9 & 0x3f);
                  *a = (*a >> 0x3f) + *a + ((4L << (bVar9 & 0x3f)) >> 1) & uVar29 * -4;
                  local_138 = (int *)-uVar29;
                  if (0 < iVar7) {
                    local_100 = 1 << ((byte)iVar7 & 0x1f);
                    uVar15 = 2L << (bVar9 & 0x3f);
                    uVar26 = (long)uVar15 >> 1;
                    local_120 = uVar26 - 1;
                    bVar39 = (int)local_118 != 0;
                    local_c8 = (ulong)(iVar6 >> 1);
                    local_130 = (ulong)(uVar12 * 2);
                    local_c0 = -local_c8;
                    local_ac = uVar12 * 3;
                    lVar19 = (long)(int)(uVar12 * 2);
                    local_b0 = uVar12 * 3 + 2;
                    local_88 = (long)(int)uVar12 << 3;
                    local_80 = a + lVar19;
                    local_60 = lVar19 * -8;
                    local_68 = a + (2 - lVar19);
                    local_b4 = uVar12 * 2 + 2;
                    local_d8 = a + 1;
                    local_168 = 1;
                    uVar30 = 1;
                    local_110 = uVar29;
                    piVar24 = (int *)(uVar29 * -2);
                    local_118 = uVar29;
                    local_f0 = (ulong)uVar12;
                    do {
                      lVar19 = local_88;
                      pLVar13 = local_d0;
                      uVar29 = local_120;
                      local_a0 = (int)local_e0;
                      local_110 = (long)local_110 >> 1;
                      local_120 = local_110 - 1;
                      local_100 = local_100 >> 1;
                      local_a4 = local_100;
                      if ((int)uVar4 <= local_100) {
                        local_a4 = 0;
                      }
                      uVar18 = (int)local_168 * 2 - (uint)((int)uVar4 <= local_100);
                      local_168 = (ulong)uVar18;
                      local_a8 = local_100;
                      if ((int)uVar12 <= local_100) {
                        local_a8 = 0;
                      }
                      n = (int)uVar30 * 2 - (uint)((int)uVar12 <= local_100);
                      uVar30 = (ulong)n;
                      local_e0 = (ulong)(local_a0 - 1);
                      if (local_a0 == 0) {
                        sVar3 = 2;
                        local_120 = 0;
                      }
                      a_00 = a;
                      uVar35 = local_168;
                      local_108 = uVar15;
                      local_9c = uVar12;
                      local_98 = uVar4;
                      if (0 < (int)uVar18) {
                        do {
                          unshuffle64(a_00,n,1,pLVar13);
                          uVar35 = uVar35 - 1;
                          a_00 = (LONGLONG *)((long)a_00 + lVar19);
                        } while (uVar35 != 0);
                      }
                      uVar15 = local_f0;
                      pLVar13 = a;
                      uVar35 = uVar30;
                      if (0 < (int)n) {
                        do {
                          unshuffle64(pLVar13,uVar18,(int)uVar15,local_d0);
                          uVar35 = uVar35 - 1;
                          pLVar13 = pLVar13 + 1;
                        } while (uVar35 != 0);
                      }
                      if (0 < iVar6 >> 1 && bVar39) {
                        local_f4 = uVar18 - 2;
                        if (4 < (int)uVar18) {
                          iVar10 = 2;
                          uVar15 = local_130 & 0xffffffff;
                          iVar7 = local_ac;
                          do {
                            if (0 < (int)n) {
                              lVar19 = (long)(int)uVar15;
                              lVar25 = 0;
                              do {
                                lVar14 = *(long *)((long)a + lVar25 * 8 + local_60 + lVar19 * 8);
                                uVar36 = local_80[lVar19 + lVar25] - a[lVar19 + lVar25];
                                uVar31 = a[lVar19 + lVar25] - lVar14;
                                uVar35 = uVar31;
                                if ((long)uVar36 < (long)uVar31) {
                                  uVar35 = uVar36;
                                }
                                if ((long)uVar31 < (long)uVar36) {
                                  uVar31 = uVar36;
                                }
                                if ((long)uVar35 < 1) {
                                  uVar35 = 0;
                                }
                                lVar27 = uVar35 * 4;
                                lVar37 = ((long)uVar31 >> 0x3f & uVar31) * 4;
                                if (lVar37 < lVar27) {
                                  lVar14 = local_80[lVar19 + lVar25] - lVar14;
                                  if (lVar14 < lVar27) {
                                    lVar27 = lVar14;
                                  }
                                  if (lVar14 <= lVar37) {
                                    lVar27 = lVar37;
                                  }
                                  uVar31 = lVar27 + a[iVar7 + lVar25] * -8;
                                  uVar35 = (long)(uVar31 + 7) >> 3;
                                  if (-1 < (long)uVar31) {
                                    uVar35 = uVar31 >> 3;
                                  }
                                  if ((long)local_c8 <= (long)uVar35) {
                                    uVar35 = local_c8;
                                  }
                                  if ((long)uVar35 <= (long)local_c0) {
                                    uVar35 = local_c0;
                                  }
                                  a[iVar7 + lVar25] = uVar35 + a[iVar7 + lVar25];
                                }
                                lVar25 = lVar25 + 2;
                              } while ((int)lVar25 < (int)n);
                            }
                            iVar10 = iVar10 + 2;
                            iVar7 = iVar7 + (int)local_130;
                            uVar15 = (ulong)(uint)((int)uVar15 + (int)local_130);
                          } while (iVar10 < local_f4);
                        }
                        if (0 < (int)uVar18) {
                          iVar10 = n - 2;
                          iVar7 = 0;
                          iVar5 = 2;
                          do {
                            if (4 < (int)n) {
                              pLVar13 = a + iVar5;
                              lVar19 = 2;
                              LVar21 = *pLVar13;
                              do {
                                lVar25 = pLVar13[lVar19];
                                uVar31 = lVar25 - LVar21;
                                uVar35 = LVar21 - pLVar13[lVar19 + -4];
                                uVar15 = uVar35;
                                if ((long)uVar31 < (long)uVar35) {
                                  uVar15 = uVar31;
                                }
                                if ((long)uVar35 < (long)uVar31) {
                                  uVar35 = uVar31;
                                }
                                if ((long)uVar15 < 1) {
                                  uVar15 = 0;
                                }
                                lVar14 = uVar15 * 4;
                                lVar27 = ((long)uVar35 >> 0x3f & uVar35) * 4;
                                if (lVar27 < lVar14) {
                                  lVar37 = lVar25 - pLVar13[lVar19 + -4];
                                  if (lVar37 < lVar14) {
                                    lVar14 = lVar37;
                                  }
                                  if (lVar37 <= lVar27) {
                                    lVar14 = lVar27;
                                  }
                                  uVar35 = lVar14 + pLVar13[lVar19 + -1] * -8;
                                  uVar15 = (long)(uVar35 + 7) >> 3;
                                  if (-1 < (long)uVar35) {
                                    uVar15 = uVar35 >> 3;
                                  }
                                  if ((long)local_c8 <= (long)uVar15) {
                                    uVar15 = local_c8;
                                  }
                                  if ((long)uVar15 <= (long)local_c0) {
                                    uVar15 = local_c0;
                                  }
                                  pLVar13[lVar19 + -1] = uVar15 + pLVar13[lVar19 + -1];
                                }
                                lVar19 = lVar19 + 2;
                                LVar21 = lVar25;
                              } while ((int)lVar19 < iVar10);
                            }
                            iVar7 = iVar7 + 2;
                            iVar5 = iVar5 + (int)local_130;
                          } while (iVar7 < (int)uVar18);
                          if (4 < (int)uVar18) {
                            local_f8 = local_b4;
                            local_fc = local_b0;
                            iVar7 = 2;
                            do {
                              local_94 = iVar7;
                              if (4 < (int)n) {
                                lVar19 = (long)local_f8;
                                local_40 = a + lVar19;
                                local_48 = local_80 + lVar19 + 2;
                                local_50 = local_68 + lVar19;
                                local_58 = local_d8 + local_fc;
                                lVar19 = 0;
                                do {
                                  local_38 = local_50[lVar19];
                                  local_e8 = local_48[lVar19 + -4];
                                  local_128 = local_48[lVar19];
                                  lVar27 = local_58[lVar19 + -1];
                                  lVar14 = local_40[lVar19];
                                  lVar16 = local_128 - lVar14;
                                  lVar22 = lVar14 - local_e8;
                                  lVar25 = local_50[lVar19 + -4] - lVar14;
                                  lVar14 = lVar14 - local_38;
                                  lVar37 = 0;
                                  if (0 < lVar25) {
                                    lVar37 = lVar25;
                                  }
                                  if (-1 < lVar25) {
                                    lVar25 = 0;
                                  }
                                  lVar28 = 0;
                                  if (0 < lVar14) {
                                    lVar28 = lVar14;
                                  }
                                  if (-1 < lVar14) {
                                    lVar14 = 0;
                                  }
                                  lVar32 = 0;
                                  if (0 < lVar22) {
                                    lVar32 = lVar22;
                                  }
                                  if (-1 < lVar22) {
                                    lVar22 = 0;
                                  }
                                  lVar33 = 0;
                                  if (0 < lVar16) {
                                    lVar33 = lVar16;
                                  }
                                  lVar2 = local_40[lVar19 + 1];
                                  if (-1 < lVar16) {
                                    lVar16 = 0;
                                  }
                                  lVar1 = lVar27 * 2 + lVar2 * 2;
                                  lVar33 = lVar33 - lVar1;
                                  lVar32 = lVar32 + lVar27 * 2 + lVar2 * -2;
                                  if (lVar33 < lVar32) {
                                    lVar32 = lVar33;
                                  }
                                  lVar37 = lVar27 * 2 + lVar37;
                                  lVar28 = lVar28 + lVar27 * -2;
                                  if (lVar37 <= lVar28) {
                                    lVar28 = lVar37;
                                  }
                                  lVar28 = lVar28 + lVar2 * 2;
                                  if (lVar28 <= lVar32) {
                                    lVar32 = lVar28;
                                  }
                                  lVar16 = lVar16 - lVar1;
                                  lVar37 = lVar22 + lVar27 * 2 + lVar2 * -2;
                                  lVar32 = lVar32 * 0x10;
                                  if (lVar37 < lVar16) {
                                    lVar37 = lVar16;
                                  }
                                  lVar14 = lVar14 + lVar27 * -2;
                                  lVar25 = lVar25 + lVar27 * 2;
                                  if (lVar14 <= lVar25) {
                                    lVar14 = lVar25;
                                  }
                                  lVar14 = lVar14 + lVar2 * 2;
                                  if (lVar37 <= lVar14) {
                                    lVar37 = lVar14;
                                  }
                                  lVar37 = lVar37 * 0x10;
                                  if (lVar37 < lVar32) {
                                    lVar25 = (local_50[lVar19 + -4] - (local_e8 + local_38)) +
                                             local_128;
                                    if (lVar25 < lVar32) {
                                      lVar32 = lVar25;
                                    }
                                    if (lVar25 <= lVar37) {
                                      lVar32 = lVar37;
                                    }
                                    uVar35 = lVar32 + local_58[lVar19] * -0x40;
                                    uVar15 = (long)(uVar35 + 0x3f) >> 6;
                                    if (-1 < (long)uVar35) {
                                      uVar15 = uVar35 >> 6;
                                    }
                                    if ((long)local_c8 <= (long)uVar15) {
                                      uVar15 = local_c8;
                                    }
                                    if ((long)uVar15 <= (long)local_c0) {
                                      uVar15 = local_c0;
                                    }
                                    local_58[lVar19] = uVar15 + local_58[lVar19];
                                  }
                                  iVar7 = (int)lVar19;
                                  lVar19 = lVar19 + 2;
                                } while (iVar7 + 4 < iVar10);
                              }
                              local_fc = local_fc + (int)local_130;
                              local_f8 = local_f8 + (int)local_130;
                              iVar7 = local_94 + 2;
                              local_90 = iVar10;
                            } while (local_94 + 2 < local_f4);
                          }
                        }
                      }
                      uVar4 = uVar18 - ((int)uVar18 >> 0x1f);
                      iVar10 = (int)n % 2;
                      local_e8 = CONCAT44(local_e8._4_4_,uVar4) & 0xfffffffffffffffe;
                      local_128 = CONCAT44(local_128._4_4_,iVar10);
                      iVar7 = (int)local_f0;
                      if ((int)(uVar4 & 0xfffffffe) < 1) {
                        iVar5 = 0;
                      }
                      else {
                        lVar19 = 0;
                        iVar5 = 0;
                        uVar15 = local_f0;
                        do {
                          if ((int)(n - iVar10) < 1) {
                            iVar23 = iVar5 * iVar7;
                            iVar34 = iVar23 + iVar7;
                          }
                          else {
                            iVar34 = (int)uVar15;
                            iVar20 = (int)lVar19;
                            lVar25 = 0;
                            do {
                              uVar35 = uVar26;
                              if (local_d8[(long)iVar34 + lVar25 + -1] < 0) {
                                uVar35 = uVar29;
                              }
                              uVar31 = uVar35 + local_d8[(long)iVar34 + lVar25 + -1] &
                                       (ulong)piVar24;
                              uVar35 = uVar26;
                              if (local_d8[iVar20 + lVar25] < 0) {
                                uVar35 = uVar29;
                              }
                              uVar36 = uVar35 + local_d8[iVar20 + lVar25] & (ulong)piVar24;
                              uVar35 = local_110;
                              if (local_d8[iVar34 + lVar25] < 0) {
                                uVar35 = local_120;
                              }
                              uVar8 = uVar35 + local_d8[iVar34 + lVar25] & (ulong)local_138;
                              uVar38 = uVar8 & local_118;
                              uVar35 = -uVar38;
                              if ((long)uVar31 < 0) {
                                uVar35 = uVar38;
                              }
                              uVar35 = uVar35 + uVar31;
                              lVar14 = local_d8[(long)iVar20 + lVar25 + -1];
                              uVar31 = -uVar38;
                              if ((long)uVar36 < 0) {
                                uVar31 = uVar38;
                              }
                              uVar31 = uVar31 + uVar36;
                              uVar36 = (uVar35 ^ uVar8 ^ uVar31) & local_108;
                              if (lVar14 < 0) {
                                uVar17 = uVar38 - uVar36;
                                if (uVar38 == 0) {
                                  uVar17 = uVar36;
                                }
                                lVar14 = uVar17 + lVar14;
                              }
                              else {
                                lVar14 = (uVar38 + lVar14) - uVar36;
                              }
                              local_d8[iVar34 + lVar25] =
                                   (long)(lVar14 + uVar35 + uVar31 + uVar8) >> sVar3;
                              local_d8[(long)iVar34 + lVar25 + -1] =
                                   (long)((lVar14 + uVar35) - (uVar31 + uVar8)) >> sVar3;
                              local_d8[iVar20 + lVar25] =
                                   (long)((uVar31 - uVar8) + (lVar14 - uVar35)) >> sVar3;
                              local_d8[(long)iVar20 + lVar25 + -1] =
                                   (long)((uVar8 - uVar31) + (lVar14 - uVar35)) >> sVar3;
                              lVar25 = lVar25 + 2;
                              iVar23 = (int)lVar25;
                            } while (iVar23 < (int)(n - iVar10));
                            iVar34 = iVar34 + iVar23;
                            iVar23 = iVar23 + iVar20;
                          }
                          if (iVar10 != 0) {
                            uVar35 = uVar26;
                            if (a[iVar34] < 0) {
                              uVar35 = uVar29;
                            }
                            uVar31 = uVar35 + a[iVar34] & (ulong)piVar24;
                            uVar35 = -(uVar31 & local_108);
                            if (a[iVar23] < 0) {
                              uVar35 = uVar31 & local_108;
                            }
                            lVar25 = uVar35 + a[iVar23];
                            a[iVar34] = (long)(lVar25 + uVar31) >> sVar3;
                            a[iVar23] = (long)(lVar25 - uVar31) >> sVar3;
                          }
                          iVar5 = iVar5 + 2;
                          lVar19 = lVar19 + local_130;
                          uVar15 = uVar15 + local_130;
                        } while (iVar5 < (int)(uint)local_e8);
                      }
                      if (uVar18 != (uint)local_e8) {
                        iVar5 = iVar5 * iVar7;
                        if (iVar10 < (int)n) {
                          lVar19 = 0;
                          do {
                            uVar15 = uVar26;
                            if (local_d8[iVar5 + lVar19] < 0) {
                              uVar15 = uVar29;
                            }
                            uVar35 = uVar15 + local_d8[iVar5 + lVar19] & (ulong)piVar24;
                            uVar15 = -(uVar35 & local_108);
                            if (local_d8[(long)iVar5 + lVar19 + -1] < 0) {
                              uVar15 = uVar35 & local_108;
                            }
                            lVar25 = uVar15 + local_d8[(long)iVar5 + lVar19 + -1];
                            local_d8[iVar5 + lVar19] = (long)(lVar25 + uVar35) >> sVar3;
                            local_d8[(long)iVar5 + lVar19 + -1] = (long)(lVar25 - uVar35) >> sVar3;
                            lVar19 = lVar19 + 2;
                          } while ((int)lVar19 < (int)(n - iVar10));
                          iVar5 = iVar5 + (int)lVar19;
                        }
                        if (iVar10 != 0) {
                          a[iVar5] = a[iVar5] >> sVar3;
                        }
                      }
                      uVar4 = local_98 - local_a4;
                      uVar12 = local_9c - local_a8;
                      uVar29 = (long)local_118 >> 1;
                      uVar35 = (long)local_138 >> 1;
                      uVar15 = local_118;
                      piVar24 = local_138;
                      uVar26 = local_110;
                      local_138 = (int *)uVar35;
                      local_118 = uVar29;
                    } while (0 < local_a0);
                  }
                  free(local_d0);
                  iVar6 = 0;
                }
                *status = iVar6;
                uVar4 = *local_78;
                uVar12 = *local_70;
                if ((int)(uVar4 * uVar12) < 1) {
                  return iVar6;
                }
                uVar29 = 0;
                do {
                  *(int *)((long)a + uVar29 * 4) = (int)a[uVar29];
                  uVar29 = uVar29 + 1;
                } while (uVar4 * uVar12 != uVar29);
                return *status;
              }
              ffpmsg("dodecode64: bad bit plane values");
              iVar6 = 0x19e;
            }
          }
        }
      }
      *a = uVar29;
      *status = iVar6;
    }
    else {
      ffpmsg("bad file format");
      *status = 0x19e;
      iVar6 = 0x19e;
    }
  }
  return iVar6;
}

Assistant:

int fits_hdecompress64(unsigned char *input, int smooth, LONGLONG *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
  int stat, *iarray, ii, nval;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode64(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize64(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv64(a, *nx, *ny, smooth, *scale);

        *status = stat;
	
         /* pack the I*8 values back into an I*4 array */
        iarray = (int *) a;
	nval = (*nx) * (*ny);

	for (ii = 0; ii < nval; ii++)
	   iarray[ii] = (int) a[ii];	

  return(*status);
}